

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D5::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D5 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdD3D56TlvFogCol1 *pMVar1;
  MthdD3D56TlvColor *pMVar2;
  MthdD3D56TlvRhw *pMVar3;
  MthdD3D56TlvZ *pMVar4;
  MthdD3D56TlvY *pMVar5;
  MthdD3D56TlvX *pMVar6;
  MthdD3D56FogColor *pMVar7;
  MthdD3D56Config *pMVar8;
  MthdD3D56Blend *pMVar9;
  MthdD3D56TexFilter *pMVar10;
  MthdD3D56TexFormat *pMVar11;
  MthdD3D56TexOffset *pMVar12;
  MthdD3D56TexColorKey *pMVar13;
  MthdCtxSurf3D *pMVar14;
  MthdDmaGrobj *pMVar15;
  MthdDmaNotify *pMVar16;
  MthdNotify *pMVar17;
  SingleMthdTest *pSVar18;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar19;
  result_type rVar20;
  MthdD3D56TlvUv *pMVar21;
  UntestedMthd *this_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_45f;
  allocator local_45e;
  allocator local_45d;
  allocator local_45c;
  allocator local_45b;
  allocator local_45a;
  allocator local_459;
  allocator local_458;
  allocator local_457;
  allocator local_456;
  allocator local_455;
  allocator local_454;
  allocator local_453;
  allocator local_452;
  allocator local_451;
  allocator local_450;
  allocator local_44f;
  allocator local_44e;
  allocator local_44d;
  allocator local_44c;
  allocator local_44b;
  allocator local_44a;
  allocator local_449;
  MthdD3D56TlvUv *local_448;
  MthdD3D56TlvFogCol1 *local_440;
  MthdD3D56TlvColor *local_438;
  MthdD3D56TlvRhw *local_430;
  MthdD3D56TlvZ *local_428;
  MthdD3D56TlvY *local_420;
  MthdD3D56TlvX *local_418;
  MthdD3D56FogColor *local_410;
  MthdD3D56Config *local_408;
  MthdD3D56Blend *local_400;
  MthdD3D56TexFilter *local_3f8;
  MthdD3D56TexFormat *local_3f0;
  MthdD3D56TexOffset *local_3e8;
  MthdD3D56TexColorKey *local_3e0;
  MthdCtxSurf3D *local_3d8;
  MthdDmaGrobj *local_3d0;
  MthdDmaGrobj *local_3c8;
  MthdDmaNotify *local_3c0;
  MthdNotify *local_3b8;
  SingleMthdTest *local_3b0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_3a8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  SingleMthdTest *local_e0;
  MthdNotify *local_d8;
  MthdDmaNotify *local_d0;
  MthdDmaGrobj *local_c8;
  MthdDmaGrobj *local_c0;
  MthdCtxSurf3D *local_b8;
  MthdD3D56TexColorKey *local_b0;
  MthdD3D56TexOffset *local_a8;
  MthdD3D56TexFormat *local_a0;
  MthdD3D56TexFilter *local_98;
  MthdD3D56Blend *local_90;
  MthdD3D56Config *local_88;
  MthdD3D56FogColor *local_80;
  MthdD3D56TlvX *local_78;
  MthdD3D56TlvY *local_70;
  MthdD3D56TlvZ *local_68;
  MthdD3D56TlvRhw *local_60;
  MthdD3D56TlvColor *local_58;
  MthdD3D56TlvFogCol1 *local_50;
  MthdD3D56TlvUv *local_48;
  MthdD3D56TlvUv *local_40;
  UntestedMthd *local_38;
  
  local_3a8 = __return_storage_ptr__;
  local_3b0 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_100,"nop",&local_449);
  pSVar18 = local_3b0;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_3b0,opt,(uint32_t)rVar20,&local_100,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_e0 = pSVar18;
  local_3b8 = (MthdNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_120,"notify",&local_44a);
  pMVar17 = local_3b8;
  MthdNotify::SingleMthdTest
            (local_3b8,opt,(uint32_t)rVar20,&local_120,-1,(this->super_Class).cls,0x104,1,4);
  local_d8 = pMVar17;
  local_3c0 = (MthdDmaNotify *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_140,"dma_notify",&local_44b);
  pMVar16 = local_3c0;
  MthdDmaNotify::SingleMthdTest
            (local_3c0,opt,(uint32_t)rVar20,&local_140,-1,(this->super_Class).cls,0x180,1,4);
  local_d0 = pMVar16;
  local_3c8 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_160,"dma_tex_a",&local_44c);
  pMVar15 = local_3c8;
  MthdDmaGrobj::MthdDmaGrobj
            (local_3c8,opt,(uint32_t)rVar20,&local_160,-1,(this->super_Class).cls,0x184,0,4);
  local_c8 = pMVar15;
  local_3d0 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_180,"dma_tex_b",&local_44d);
  pMVar15 = local_3d0;
  MthdDmaGrobj::MthdDmaGrobj
            (local_3d0,opt,(uint32_t)rVar20,&local_180,-1,(this->super_Class).cls,0x188,1,4);
  local_c0 = pMVar15;
  local_3d8 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1a0,"ctx_surf3d",&local_44e);
  pMVar14 = local_3d8;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_3d8,opt,(uint32_t)rVar20,&local_1a0,-1,(this->super_Class).cls,0x18c,0);
  local_b8 = pMVar14;
  local_3e0 = (MthdD3D56TexColorKey *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1c0,"tex_color_key",&local_44f);
  pMVar13 = local_3e0;
  MthdD3D56TexColorKey::SingleMthdTest
            (local_3e0,opt,(uint32_t)rVar20,&local_1c0,-1,(this->super_Class).cls,0x300,1,4);
  local_b0 = pMVar13;
  local_3e8 = (MthdD3D56TexOffset *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1e0,"tex_offset",&local_450);
  pMVar12 = local_3e8;
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (local_3e8,opt,(uint32_t)rVar20,&local_1e0,-1,(this->super_Class).cls,0x304,3);
  local_a8 = pMVar12;
  local_3f0 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_200,"tex_format",&local_451);
  pMVar11 = local_3f0;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_3f0,opt,(uint32_t)rVar20,&local_200,-1,(this->super_Class).cls,0x308,3);
  local_a0 = pMVar11;
  local_3f8 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_220,"tex_filter",&local_452);
  pMVar10 = local_3f8;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_3f8,opt,(uint32_t)rVar20,&local_220,-1,(this->super_Class).cls,0x30c,3);
  local_98 = pMVar10;
  local_400 = (MthdD3D56Blend *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_240,"blend",&local_453);
  pMVar9 = local_400;
  MthdD3D56Blend::SingleMthdTest
            (local_400,opt,(uint32_t)rVar20,&local_240,-1,(this->super_Class).cls,0x310,1,4);
  local_90 = pMVar9;
  local_408 = (MthdD3D56Config *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_260,"config",&local_454);
  pMVar8 = local_408;
  MthdD3D56Config::SingleMthdTest
            (local_408,opt,(uint32_t)rVar20,&local_260,-1,(this->super_Class).cls,0x314,1,4);
  local_88 = pMVar8;
  local_410 = (MthdD3D56FogColor *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_280,"fog_color",&local_455);
  pMVar7 = local_410;
  MthdD3D56FogColor::SingleMthdTest
            (local_410,opt,(uint32_t)rVar20,&local_280,-1,(this->super_Class).cls,0x318,1,4);
  local_80 = pMVar7;
  local_418 = (MthdD3D56TlvX *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2a0,"tlv_x",&local_456);
  pMVar6 = local_418;
  MthdD3D56TlvX::SingleMthdTest
            (local_418,opt,(uint32_t)rVar20,&local_2a0,-1,(this->super_Class).cls,0x400,0x10,0x20);
  local_78 = pMVar6;
  local_420 = (MthdD3D56TlvY *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2c0,"tlv_y",&local_457);
  pMVar5 = local_420;
  MthdD3D56TlvY::SingleMthdTest
            (local_420,opt,(uint32_t)rVar20,&local_2c0,-1,(this->super_Class).cls,0x404,0x10,0x20);
  local_70 = pMVar5;
  local_428 = (MthdD3D56TlvZ *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2e0,"tlv_z",&local_458);
  pMVar4 = local_428;
  MthdD3D56TlvZ::SingleMthdTest
            (local_428,opt,(uint32_t)rVar20,&local_2e0,-1,(this->super_Class).cls,0x408,0x10,0x20);
  local_68 = pMVar4;
  local_430 = (MthdD3D56TlvRhw *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_300,"tlv_rhw",&local_459);
  pMVar3 = local_430;
  MthdD3D56TlvRhw::SingleMthdTest
            (local_430,opt,(uint32_t)rVar20,&local_300,-1,(this->super_Class).cls,0x40c,0x10,0x20);
  local_60 = pMVar3;
  local_438 = (MthdD3D56TlvColor *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_320,"tlv_color",&local_45a);
  pMVar2 = local_438;
  MthdD3D56TlvColor::SingleMthdTest
            (local_438,opt,(uint32_t)rVar20,&local_320,-1,(this->super_Class).cls,0x410,0x10,0x20);
  local_58 = pMVar2;
  local_440 = (MthdD3D56TlvFogCol1 *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_340,"tlv_fog_col1",&local_45b);
  pMVar1 = local_440;
  MthdD3D56TlvFogCol1::SingleMthdTest
            (local_440,opt,(uint32_t)rVar20,&local_340,-1,(this->super_Class).cls,0x414,0x10,0x20);
  local_50 = pMVar1;
  local_448 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_360,"tlv_u",&local_45c);
  pMVar21 = local_448;
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (local_448,opt,(uint32_t)rVar20,&local_360,-1,(this->super_Class).cls,0x418,0x10,0x20,0,
             0,false);
  local_48 = pMVar21;
  pMVar21 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_380,"tlv_v",&local_45d);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar21,opt,(uint32_t)rVar20,&local_380,-1,(this->super_Class).cls,0x41c,0x10,0x20,0,1,
             true);
  local_40 = pMVar21;
  this_01 = (UntestedMthd *)operator_new(0x25950);
  rVar20 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3a0,"draw",&local_45e);
  UntestedMthd::SingleMthdTest
            (this_01,opt,(uint32_t)rVar20,&local_3a0,-1,(this->super_Class).cls,0x600,0x40,4);
  pvVar19 = local_3a8;
  __l._M_len = 0x16;
  __l._M_array = &local_e0;
  local_38 = this_01;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_3a8,__l,&local_45f);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  return pvVar19;
}

Assistant:

std::vector<SingleMthdTest *> D3D5::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexColorKey(opt, rnd(), "tex_color_key", -1, cls, 0x300),
		new MthdD3D56TexOffset(opt, rnd(), "tex_offset", -1, cls, 0x304, 3),
		new MthdD3D56TexFormat(opt, rnd(), "tex_format", -1, cls, 0x308, 3),
		new MthdD3D56TexFilter(opt, rnd(), "tex_filter", -1, cls, 0x30c, 3),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x310),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x314),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x318),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 0x10, 0x20),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 0x10, 0x20),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 0x10, 0x20),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 0x10, 0x20),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 0x10, 0x20),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 0x10, 0x20),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u", -1, cls, 0x418, 0x10, 0x20, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v", -1, cls, 0x41c, 0x10, 0x20, 0, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x600, 0x40),
	};
}